

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbr2_probe_bw.cc
# Opt level: O1

bool __thiscall
quic::Bbr2ProbeBwMode::IsTimeToProbeForRenoCoexistence
          (Bbr2ProbeBwMode *this,double probe_wait_fraction,Bbr2CongestionEvent *param_2)

{
  QuicRoundTripCount QVar1;
  Bbr2Sender *this_00;
  QuicByteCount QVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  
  this_00 = (this->super_Bbr2ModeBase).sender_;
  uVar4 = (ulong)(this_00->params_).probe_bw_probe_max_rounds;
  if (0.0 < (this_00->params_).probe_bw_probe_reno_gain) {
    QVar2 = Bbr2Sender::GetTargetBytesInflight(this_00);
    fVar5 = ((float)QVar2 * (((this->super_Bbr2ModeBase).sender_)->params_).probe_bw_probe_reno_gain
            ) / 1460.0;
    uVar3 = (ulong)fVar5;
    uVar3 = (long)(fVar5 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3;
    if (uVar3 < uVar4) {
      uVar4 = uVar3;
    }
  }
  QVar1 = (this->cycle_).rounds_since_probe;
  return (double)(long)uVar4 * probe_wait_fraction <=
         ((double)CONCAT44(0x45300000,(int)(QVar1 >> 0x20)) - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)QVar1) - 4503599627370496.0);
}

Assistant:

bool Bbr2ProbeBwMode::IsTimeToProbeForRenoCoexistence(
    double probe_wait_fraction,
    const Bbr2CongestionEvent& /*congestion_event*/) const {
  uint64_t rounds = Params().probe_bw_probe_max_rounds;
  if (Params().probe_bw_probe_reno_gain > 0.0) {
    QuicByteCount target_bytes_inflight = sender_->GetTargetBytesInflight();
    uint64_t reno_rounds = Params().probe_bw_probe_reno_gain *
                           target_bytes_inflight / kDefaultTCPMSS;
    rounds = std::min(rounds, reno_rounds);
  }
  bool result = cycle_.rounds_since_probe >= (rounds * probe_wait_fraction);
 /* QUIC_DVLOG(3) << sender_ << " " << cycle_.phase
                << ": IsTimeToProbeForRenoCoexistence=" << result
                << ". rounds_since_probe:" << cycle_.rounds_since_probe
                << ", rounds:" << rounds
                << ", probe_wait_fraction:" << probe_wait_fraction;*/
  return result;
}